

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.hpp
# Opt level: O2

void __thiscall
sglr::rc::ObjectManager<sglr::rc::VertexArray>::getAll
          (ObjectManager<sglr::rc::VertexArray> *this,
          vector<sglr::rc::VertexArray_*,_std::allocator<sglr::rc::VertexArray_*>_> *objects)

{
  _Self __tmp;
  _Rb_tree_node_base *p_Var1;
  pointer ppVVar2;
  
  std::vector<sglr::rc::VertexArray_*,_std::allocator<sglr::rc::VertexArray_*>_>::resize
            (objects,(this->m_objects)._M_t._M_impl.super__Rb_tree_header._M_node_count);
  ppVVar2 = (objects->
            super__Vector_base<sglr::rc::VertexArray_*,_std::allocator<sglr::rc::VertexArray_*>_>).
            _M_impl.super__Vector_impl_data._M_start;
  for (p_Var1 = (this->m_objects)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(this->m_objects)._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1)) {
    *ppVVar2 = (VertexArray *)p_Var1[1]._M_parent;
    ppVVar2 = ppVVar2 + 1;
  }
  return;
}

Assistant:

void ObjectManager<T>::getAll (typename std::vector<T*>& objects) const
{
	objects.resize(m_objects.size());
	typename std::vector<T*>::iterator dst = objects.begin();

	for (typename std::map<deUint32, T*>::const_iterator i = m_objects.begin();
		 i != m_objects.end(); i++)
	{
		*dst++ = i->second;
	}
}